

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O3

void slang::SVInt::splitWords(SVInt *value,uint32_t *dest,uint32_t numWords)

{
  SVInt *pSVar1;
  undefined8 uVar2;
  ulong uVar3;
  SVInt *pSVar4;
  
  if (numWords != 0) {
    uVar3 = 0;
    do {
      pSVar1 = (SVInt *)(value->super_SVIntStorage).field_0.val;
      pSVar4 = value;
      if (((value->super_SVIntStorage).unknownFlag & 1U) != 0) {
        pSVar4 = pSVar1;
      }
      if (0x40 < (value->super_SVIntStorage).bitWidth) {
        pSVar4 = pSVar1;
      }
      uVar2 = *(undefined8 *)((long)&(pSVar4->super_SVIntStorage).field_0 + uVar3 * 4);
      dest[uVar3 & 0xffffffff] = (uint32_t)uVar2;
      dest[(int)uVar3 + 1] = (uint32_t)((ulong)uVar2 >> 0x20);
      uVar3 = uVar3 + 2;
    } while ((ulong)numWords * 2 != uVar3);
  }
  return;
}

Assistant:

void SVInt::splitWords(const SVInt& value, uint32_t* dest, uint32_t numWords) {
    for (uint32_t i = 0; i < numWords; i++) {
        uint64_t val = value.getRawData()[i];
        dest[i * 2] = uint32_t(val);
        dest[i * 2 + 1] = uint32_t(val >> 32);
    }
}